

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O0

void __thiscall
crnlib::dxt1_endpoint_optimizer::compute_pca
          (dxt1_endpoint_optimizer *this,vec3F *axis,vec3F_array *norm_colors,vec3F *def)

{
  uint uVar1;
  vec<3U,_float> *this_00;
  unique_color *puVar2;
  vec<3U,_float> *in_RCX;
  vector<crnlib::vec<3U,_float>_> *in_RDX;
  vec<3U,_float> *in_RSI;
  long in_RDI;
  float fVar3;
  float fVar4;
  float fVar5;
  double dVar6;
  double dVar7;
  double len;
  double delta;
  double m;
  double b_1;
  double g_1;
  double r_1;
  uint iter;
  double vfb;
  double vfg;
  double vfr;
  double weight;
  float b;
  float g;
  float r;
  vec3F *v;
  uint i;
  double cov [6];
  double in_stack_ffffffffffffff08;
  double in_stack_ffffffffffffff10;
  double local_b8;
  double local_b0;
  double local_a8;
  uint local_9c;
  double local_98;
  double local_90;
  double local_88;
  uint local_5c;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  vec<3U,_float> *local_20;
  vector<crnlib::vec<3U,_float>_> *local_18;
  vec<3U,_float> *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  memset(&local_58,0,0x30);
  for (local_5c = 0; uVar1 = vector<crnlib::vec<3U,_float>_>::size(local_18), local_5c < uVar1;
      local_5c = local_5c + 1) {
    this_00 = vector<crnlib::vec<3U,_float>_>::operator[](local_18,local_5c);
    fVar3 = vec<3U,_float>::operator[](this_00,0);
    fVar4 = vec<3U,_float>::operator[](this_00,1);
    fVar5 = vec<3U,_float>::operator[](this_00,2);
    puVar2 = vector<crnlib::unique_color>::operator[]
                       ((vector<crnlib::unique_color> *)(in_RDI + 0x38),local_5c);
    if (puVar2->m_weight < 2) {
      local_58 = (double)(fVar3 * fVar3) + local_58;
      local_50 = (double)(fVar3 * fVar4) + local_50;
      local_48 = (double)(fVar3 * fVar5) + local_48;
      local_40 = (double)(fVar4 * fVar4) + local_40;
      local_38 = (double)(fVar4 * fVar5) + local_38;
      local_30 = (double)(fVar5 * fVar5) + local_30;
    }
    else {
      puVar2 = vector<crnlib::unique_color>::operator[]
                         ((vector<crnlib::unique_color> *)(in_RDI + 0x38),local_5c);
      dVar6 = (double)puVar2->m_weight;
      local_58 = (double)(fVar3 * fVar3) * dVar6 + local_58;
      local_50 = (double)(fVar3 * fVar4) * dVar6 + local_50;
      local_48 = (double)(fVar3 * fVar5) * dVar6 + local_48;
      local_40 = (double)(fVar4 * fVar4) * dVar6 + local_40;
      local_38 = (double)(fVar4 * fVar5) * dVar6 + local_38;
      local_30 = (double)(fVar5 * fVar5) * dVar6 + local_30;
    }
  }
  local_88 = 0.8999999761581421;
  local_90 = 1.0;
  local_98 = 0.699999988079071;
  for (local_9c = 0; local_9c < 8; local_9c = local_9c + 1) {
    local_a8 = local_88 * local_58 + local_90 * local_50 + local_98 * local_48;
    local_b0 = local_88 * local_50 + local_90 * local_40 + local_98 * local_38;
    local_b8 = local_88 * local_48 + local_90 * local_38 + local_98 * local_30;
    dVar6 = math::maximum<double>
                      (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,9.51054629355983e-318);
    if (1e-10 < dVar6) {
      dVar6 = 1.0 / dVar6;
      local_a8 = dVar6 * local_a8;
      local_b0 = dVar6 * local_b0;
      local_b8 = dVar6 * local_b8;
    }
    in_stack_ffffffffffffff10 = math::square<double>(local_88 - local_a8);
    dVar6 = math::square<double>(local_90 - local_b0);
    dVar6 = in_stack_ffffffffffffff10 + dVar6;
    dVar7 = math::square<double>(local_98 - local_b8);
    local_88 = local_a8;
    local_90 = local_b0;
    local_98 = local_b8;
    if ((2 < local_9c) && (dVar6 + dVar7 < 1e-08)) break;
  }
  dVar6 = local_88 * local_88 + local_90 * local_90 + local_98 * local_98;
  if (1e-10 <= dVar6) {
    dVar6 = sqrt(dVar6);
    dVar6 = 1.0 / dVar6;
    vec<3U,_float>::set(local_10,(float)(local_88 * dVar6),(float)(local_90 * dVar6),
                        (float)(local_98 * dVar6));
  }
  else {
    vec<3U,_float>::operator=(local_10,local_20);
  }
  return;
}

Assistant:

void dxt1_endpoint_optimizer::compute_pca(vec3F& axis, const vec3F_array& norm_colors, const vec3F& def) {
  double cov[6] = {0, 0, 0, 0, 0, 0};
  for (uint i = 0; i < norm_colors.size(); i++) {
    const vec3F& v = norm_colors[i];
    float r = v[0];
    float g = v[1];
    float b = v[2];
    if (m_unique_colors[i].m_weight > 1) {
      const double weight = m_unique_colors[i].m_weight;
      cov[0] += r * r * weight;
      cov[1] += r * g * weight;
      cov[2] += r * b * weight;
      cov[3] += g * g * weight;
      cov[4] += g * b * weight;
      cov[5] += b * b * weight;
    } else {
      cov[0] += r * r;
      cov[1] += r * g;
      cov[2] += r * b;
      cov[3] += g * g;
      cov[4] += g * b;
      cov[5] += b * b;
    }
  }
  double vfr = .9f;
  double vfg = 1.0f;
  double vfb = .7f;
  for (uint iter = 0; iter < 8; iter++) {
    double r = vfr * cov[0] + vfg * cov[1] + vfb * cov[2];
    double g = vfr * cov[1] + vfg * cov[3] + vfb * cov[4];
    double b = vfr * cov[2] + vfg * cov[4] + vfb * cov[5];
    double m = math::maximum(fabs(r), fabs(g), fabs(b));
    if (m > 1e-10) {
      m = 1.0f / m;
      r *= m;
      g *= m;
      b *= m;
    }
    double delta = math::square(vfr - r) + math::square(vfg - g) + math::square(vfb - b);
    vfr = r;
    vfg = g;
    vfb = b;
    if ((iter > 2) && (delta < 1e-8))
      break;
  }
  double len = vfr * vfr + vfg * vfg + vfb * vfb;
  if (len < 1e-10) {
    axis = def;
  } else {
    len = 1.0f / sqrt(len);
    axis.set(static_cast<float>(vfr * len), static_cast<float>(vfg * len), static_cast<float>(vfb * len));
  }
}